

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MruDictionary.h
# Opt level: O2

MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
* JsUtil::
  MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
  ::New(Recycler *allocator,int mruListCapacity)

{
  Recycler *alloc;
  MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
  *this;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])
             &MruDictionary<UnifiedRegex::RegexKey,UnifiedRegex::RegexPattern*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2cdcfd3;
  data.filename._0_4_ = 0x74;
  alloc = Memory::Recycler::TrackAllocInfo(allocator,(TrackAllocData *)local_48);
  this = (MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
          *)new<Memory::Recycler>(0x50,alloc,0x37ff80);
  MruDictionary(this,allocator,mruListCapacity);
  return this;
}

Assistant:

static MruDictionary *New(TAllocator *const allocator, DECLSPEC_GUARD_OVERFLOW const int mruListCapacity)
        {
            return AllocatorNew(TAllocator, allocator, MruDictionary, allocator, mruListCapacity);
        }